

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_default.c
# Opt level: O1

mpt_metatype * mpt_metatype_default(void)

{
  return &mpt_metatype_default::mt;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_metatype_default()
{
	static const MPT_INTERFACE_VPTR(metatype) ctl = {
		{ genMetaConv },
		genMetaUnref,
		genMetaRef,
		genMetaClone
	};
	static MPT_INTERFACE(metatype) mt = { &ctl };
	return &mt;
}